

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextodfwriter.cpp
# Opt level: O0

void __thiscall
QTextOdfWriter::writeFrameFormat
          (QTextOdfWriter *this,QXmlStreamWriter *writer,QTextFrameFormat *format,int formatIndex)

{
  bool bVar1;
  QAnyStringView *in_RSI;
  long in_FS_OFFSET;
  QByteArrayView QVar2;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  undefined8 in_stack_fffffffffffffbb8;
  int base;
  QTextFrameFormat *this_00;
  undefined8 in_stack_fffffffffffffbc0;
  undefined4 in_stack_fffffffffffffbc8;
  int in_stack_fffffffffffffbcc;
  QTextFormat *in_stack_fffffffffffffbd0;
  undefined8 in_stack_fffffffffffffbd8;
  QChar fillChar;
  QAnyStringView *pQVar12;
  qreal local_3b8;
  double local_3b0 [6];
  storage_type *local_380;
  undefined1 local_370 [40];
  QAnyStringView *local_348;
  QAnyStringView *local_340;
  qreal local_338;
  double local_330 [4];
  QTextFrameFormat *local_310;
  storage_type *local_300;
  undefined1 local_2f0 [40];
  QAnyStringView *local_2c8;
  QAnyStringView *local_2c0;
  qreal local_2b8;
  double local_2b0 [4];
  QTextFrameFormat *local_290;
  storage_type *local_280;
  undefined1 local_270 [40];
  QAnyStringView *local_248;
  QAnyStringView *local_240;
  qreal local_238;
  double local_230 [4];
  QTextFrameFormat *local_210;
  storage_type *local_200;
  undefined1 local_1f0 [40];
  QAnyStringView *local_1c8;
  QAnyStringView *local_1c0;
  storage_type *local_1b8;
  undefined1 local_1a8 [40];
  QAnyStringView *local_180;
  storage_type *local_170;
  undefined1 local_160 [24];
  QTextFrameFormat *local_148;
  storage_type *local_138;
  undefined1 local_128 [40];
  QAnyStringView *local_100;
  QAnyStringView *local_f8;
  QChar local_ea;
  storage_type *local_e8;
  undefined1 local_d8 [64];
  storage_type *local_98;
  undefined1 local_88 [40];
  QAnyStringView *local_60;
  QAnyStringView *local_58;
  storage_type *local_50;
  undefined1 local_40 [40];
  QAnyStringView *local_18;
  long local_8;
  
  fillChar.ucs = (char16_t)((ulong)in_stack_fffffffffffffbd8 >> 0x30);
  base = (int)((ulong)in_stack_fffffffffffffbb8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QAnyStringView::QAnyStringView
            ((QAnyStringView *)in_stack_fffffffffffffbd0,
             (QString *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  QByteArrayView::QByteArrayView<6ul>
            ((QByteArrayView *)in_stack_fffffffffffffbd0,
             (char (*) [6])CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  QVar2.m_data = local_50;
  QVar2.m_size = (qsizetype)local_40;
  QString::fromLatin1(QVar2);
  QAnyStringView::QAnyStringView
            ((QAnyStringView *)in_stack_fffffffffffffbd0,
             (QString *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  QXmlStreamWriter::writeStartElement((QAnyStringView *)in_RSI,local_18);
  QString::~QString((QString *)0x9f3a42);
  QAnyStringView::QAnyStringView
            ((QAnyStringView *)in_stack_fffffffffffffbd0,
             (QString *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  QByteArrayView::QByteArrayView<5ul>
            ((QByteArrayView *)in_stack_fffffffffffffbd0,
             (char (*) [5])CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  QVar3.m_data = local_98;
  QVar3.m_size = (qsizetype)local_88;
  QString::fromLatin1(QVar3);
  QAnyStringView::QAnyStringView
            ((QAnyStringView *)in_stack_fffffffffffffbd0,
             (QString *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  QByteArrayView::QByteArrayView<4ul>
            ((QByteArrayView *)in_stack_fffffffffffffbd0,
             (char (*) [4])CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  QVar4.m_data = local_e8;
  QVar4.m_size = (qsizetype)local_d8;
  QString::fromLatin1(QVar4);
  QChar::QChar<char16_t,_true>(&local_ea,L' ');
  QString::arg<int,_true>
            ((QString *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
             (int)((ulong)in_stack_fffffffffffffbc0 >> 0x20),(int)in_stack_fffffffffffffbc0,base,
             fillChar);
  QAnyStringView::QAnyStringView
            ((QAnyStringView *)in_stack_fffffffffffffbd0,
             (QString *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  QXmlStreamWriter::writeAttribute((QAnyStringView *)in_RSI,local_60,local_58);
  QString::~QString((QString *)0x9f3b84);
  QString::~QString((QString *)0x9f3b91);
  QString::~QString((QString *)0x9f3b9e);
  QAnyStringView::QAnyStringView
            ((QAnyStringView *)in_stack_fffffffffffffbd0,
             (QString *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  QByteArrayView::QByteArrayView<7ul>
            ((QByteArrayView *)in_stack_fffffffffffffbd0,
             (char (*) [7])CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  QVar5.m_data = local_138;
  QVar5.m_size = (qsizetype)local_128;
  QString::fromLatin1(QVar5);
  QAnyStringView::QAnyStringView
            ((QAnyStringView *)in_stack_fffffffffffffbd0,
             (QString *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  QByteArrayView::QByteArrayView<8ul>
            ((QByteArrayView *)in_stack_fffffffffffffbd0,
             (char (*) [8])CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  QVar6.m_data = local_170;
  QVar6.m_size = (qsizetype)local_160;
  QString::fromLatin1(QVar6);
  QAnyStringView::QAnyStringView
            ((QAnyStringView *)in_stack_fffffffffffffbd0,
             (QString *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  QXmlStreamWriter::writeAttribute((QAnyStringView *)in_RSI,local_100,local_f8);
  QString::~QString((QString *)0x9f3c9c);
  QString::~QString((QString *)0x9f3ca9);
  QAnyStringView::QAnyStringView
            ((QAnyStringView *)in_stack_fffffffffffffbd0,
             (QString *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  QByteArrayView::QByteArrayView<19ul>
            ((QByteArrayView *)in_stack_fffffffffffffbd0,
             (char (*) [19])CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  QVar7.m_data = local_1b8;
  QVar7.m_size = (qsizetype)local_1a8;
  QString::fromLatin1(QVar7);
  QAnyStringView::QAnyStringView
            ((QAnyStringView *)in_stack_fffffffffffffbd0,
             (QString *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  QXmlStreamWriter::writeEmptyElement((QAnyStringView *)in_RSI,local_180);
  QString::~QString((QString *)0x9f3d49);
  bVar1 = QTextFormat::hasProperty(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbcc);
  this_00 = local_148;
  if (bVar1) {
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffffbd0,
               (QString *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
    QByteArrayView::QByteArrayView<11ul>
              ((QByteArrayView *)in_stack_fffffffffffffbd0,
               (char (*) [11])CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
    QVar8.m_data = local_200;
    QVar8.m_size = (qsizetype)local_1f0;
    QString::fromLatin1(QVar8);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffffbd0,
               (QString *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
    local_230[0] = 0.0;
    local_238 = QTextFrameFormat::topMargin(local_148);
    qMax<double>(local_230,&local_238);
    pixelToPoint((qreal)in_stack_fffffffffffffbd0);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffffbd0,
               (QString *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
    QXmlStreamWriter::writeAttribute((QAnyStringView *)in_RSI,local_1c8,local_1c0);
    QString::~QString((QString *)0x9f3e73);
    QString::~QString((QString *)0x9f3e80);
    this_00 = local_210;
  }
  bVar1 = QTextFormat::hasProperty(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbcc);
  if (bVar1) {
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffffbd0,
               (QString *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
    QByteArrayView::QByteArrayView<14ul>
              ((QByteArrayView *)in_stack_fffffffffffffbd0,
               (char (*) [14])CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
    QVar9.m_data = local_280;
    QVar9.m_size = (qsizetype)local_270;
    QString::fromLatin1(QVar9);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffffbd0,
               (QString *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
    local_2b0[0] = 0.0;
    local_2b8 = QTextFrameFormat::bottomMargin(this_00);
    qMax<double>(local_2b0,&local_2b8);
    pixelToPoint((qreal)in_stack_fffffffffffffbd0);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffffbd0,
               (QString *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
    QXmlStreamWriter::writeAttribute((QAnyStringView *)in_RSI,local_248,local_240);
    QString::~QString((QString *)0x9f3faa);
    QString::~QString((QString *)0x9f3fb7);
    this_00 = local_290;
  }
  bVar1 = QTextFormat::hasProperty(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbcc);
  if (bVar1) {
    pQVar12 = in_RSI;
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffffbd0,
               (QString *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
    QByteArrayView::QByteArrayView<12ul>
              ((QByteArrayView *)in_stack_fffffffffffffbd0,
               (char (*) [12])CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
    QVar10.m_data = local_300;
    QVar10.m_size = (qsizetype)local_2f0;
    QString::fromLatin1(QVar10);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffffbd0,
               (QString *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
    local_330[0] = 0.0;
    local_338 = QTextFrameFormat::leftMargin(this_00);
    qMax<double>(local_330,&local_338);
    pixelToPoint((qreal)in_stack_fffffffffffffbd0);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffffbd0,
               (QString *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
    QXmlStreamWriter::writeAttribute((QAnyStringView *)pQVar12,local_2c8,local_2c0);
    QString::~QString((QString *)0x9f40e1);
    QString::~QString((QString *)0x9f40ee);
    this_00 = local_310;
  }
  bVar1 = QTextFormat::hasProperty(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbcc);
  if (bVar1) {
    QAnyStringView::QAnyStringView
              (in_RSI,(QString *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
    QByteArrayView::QByteArrayView<13ul>
              ((QByteArrayView *)in_RSI,
               (char (*) [13])CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
    QVar11.m_data = local_380;
    QVar11.m_size = (qsizetype)local_370;
    QString::fromLatin1(QVar11);
    QAnyStringView::QAnyStringView
              (in_RSI,(QString *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
    local_3b0[0] = 0.0;
    local_3b8 = QTextFrameFormat::rightMargin(this_00);
    qMax<double>(local_3b0,&local_3b8);
    pixelToPoint((qreal)in_RSI);
    QAnyStringView::QAnyStringView
              (in_RSI,(QString *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
    QXmlStreamWriter::writeAttribute((QAnyStringView *)in_RSI,local_348,local_340);
    QString::~QString((QString *)0x9f4218);
    QString::~QString((QString *)0x9f4225);
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextOdfWriter::writeFrameFormat(QXmlStreamWriter &writer, QTextFrameFormat format, int formatIndex) const
{
    writer.writeStartElement(styleNS, QString::fromLatin1("style"));
    writer.writeAttribute(styleNS, QString::fromLatin1("name"), QString::fromLatin1("s%1").arg(formatIndex));
    writer.writeAttribute(styleNS, QString::fromLatin1("family"), QString::fromLatin1("section"));
    writer.writeEmptyElement(styleNS, QString::fromLatin1("section-properties"));
    if (format.hasProperty(QTextFormat::FrameTopMargin))
        writer.writeAttribute(foNS, QString::fromLatin1("margin-top"), pixelToPoint(qMax(qreal(0.), format.topMargin())) );
    if (format.hasProperty(QTextFormat::FrameBottomMargin))
        writer.writeAttribute(foNS, QString::fromLatin1("margin-bottom"), pixelToPoint(qMax(qreal(0.), format.bottomMargin())) );
    if (format.hasProperty(QTextFormat::FrameLeftMargin))
        writer.writeAttribute(foNS, QString::fromLatin1("margin-left"), pixelToPoint(qMax(qreal(0.), format.leftMargin())) );
    if (format.hasProperty(QTextFormat::FrameRightMargin))
        writer.writeAttribute(foNS, QString::fromLatin1("margin-right"), pixelToPoint(qMax(qreal(0.), format.rightMargin())) );

    writer.writeEndElement(); // style

// TODO consider putting the following properties in a qt-namespace.
// Position   position () const
// qreal   border () const
// QBrush   borderBrush () const
// BorderStyle   borderStyle () const
// qreal   padding () const
// QTextLength   width () const
// QTextLength   height () const
// PageBreakFlags   pageBreakPolicy () const
}